

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O3

boolean use_figurine(obj *obj)

{
  boolean bVar1;
  boolean bVar2;
  int iVar3;
  undefined8 in_RAX;
  char x;
  char y;
  char *pcVar4;
  schar dy;
  schar dx;
  schar dz;
  coord cc;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (((u._1052_1_ & 1) != 0) &&
     (bVar1 = figurine_location_checks(obj,(coord *)0x0,'\0'), bVar1 == '\0')) {
    return '\0';
  }
  iVar3 = getdir((char *)0x0,(schar *)((long)&uStack_38 + 4),(schar *)((long)&uStack_38 + 3),
                 (schar *)((long)&uStack_38 + 5));
  if (iVar3 == 0) {
    multi = 0;
    flags.move = '\0';
    bVar1 = '\0';
  }
  else {
    x = uStack_38._4_1_ + u.ux;
    y = uStack_38._3_1_ + u.uy;
    uStack_38 = CONCAT17(y,CONCAT16(x,(undefined6)uStack_38));
    bVar1 = '\0';
    bVar2 = figurine_location_checks(obj,(coord *)((long)&uStack_38 + 6),'\0');
    if (bVar2 != '\0') {
      if (uStack_38._3_1_ == '\0' && uStack_38._4_1_ == '\0') {
        bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level);
        pcVar4 = "release the figurine";
        if (((bVar1 == '\0') &&
            (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) &&
           (bVar1 = is_pool(level,(int)x,(int)y), bVar1 == '\0')) {
          pcVar4 = "set the figurine on the ground";
          if (uStack_38._5_1_ < '\0') {
            pcVar4 = "toss the figurine into the air";
          }
        }
      }
      else {
        pcVar4 = "set the figurine beside you";
      }
      pline("You %s and it transforms.",pcVar4);
      make_familiar(obj,x,y,'\0');
      stop_timer(obj->olev,5,obj);
      useup(obj);
      bVar1 = '\x01';
    }
  }
  return bVar1;
}

Assistant:

static boolean use_figurine(struct obj *obj)
{
	xchar x, y;
	coord cc;
	schar dx, dy, dz;

	if (u.uswallow) {
		/* can't activate a figurine while swallowed */
		if (!figurine_location_checks(obj, NULL, FALSE))
			return FALSE;
	}
	if (!getdir(NULL, &dx, &dy, &dz)) {
		flags.move = multi = 0;
		return FALSE;
	}
	
	x = u.ux + dx;
	y = u.uy + dy;
	cc.x = x;
	cc.y = y;
	
	/* Passing FALSE arg here will result in messages displayed */
	if (!figurine_location_checks(obj, &cc, FALSE))
	    return FALSE;
	pline("You %s and it transforms.",
	    (dx || dy) ? "set the figurine beside you" :
	    (Is_airlevel(&u.uz) || Is_waterlevel(&u.uz) ||
	     is_pool(level, cc.x, cc.y)) ?
		"release the figurine" :
	    (dz < 0 ?
		"toss the figurine into the air" :
		"set the figurine on the ground"));
	make_familiar(obj, cc.x, cc.y, FALSE);
	stop_timer(obj->olev, FIG_TRANSFORM, obj);
	useup(obj);
	
	return TRUE;
}